

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O2

int main(void)

{
  test256x256();
  test320x320();
  test501x303();
  testHD();
  testFullHD();
  test2K();
  test4K();
  return 0;
}

Assistant:

int main() {
    test256x256();
    test320x320();
    test501x303();
    testHD();
    testFullHD();
    test2K();
    test4K();
    return 0;
}